

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

int js_std_init(JSContext *ctx,JSModuleDef *m)

{
  JSRuntime *rt;
  JSValue JVar1;
  
  JS_NewClassID(&js_std_file_class_id);
  rt = JS_GetRuntime(ctx);
  JS_NewClass(rt,js_std_file_class_id,&js_std_file_class);
  JVar1 = JS_NewObject(ctx);
  JS_SetPropertyFunctionList(ctx,JVar1,js_std_file_proto_funcs,0x11);
  JS_SetClassProto(ctx,js_std_file_class_id,JVar1);
  JS_SetModuleExportList(ctx,m,js_std_funcs,0x17);
  JVar1 = js_new_std_file(ctx,_stdin,0,0);
  JS_SetModuleExport(ctx,m,"in",JVar1);
  JVar1 = js_new_std_file(ctx,_stdout,0,0);
  JS_SetModuleExport(ctx,m,"out",JVar1);
  JVar1 = js_new_std_file(ctx,_stderr,0,0);
  JS_SetModuleExport(ctx,m,"err",JVar1);
  return 0;
}

Assistant:

static int js_std_init(JSContext *ctx, JSModuleDef *m)
{
    JSValue proto;
    
    /* FILE class */
    /* the class ID is created once */
    JS_NewClassID(&js_std_file_class_id);
    /* the class is created once per runtime */
    JS_NewClass(JS_GetRuntime(ctx), js_std_file_class_id, &js_std_file_class);
    proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, proto, js_std_file_proto_funcs,
                               countof(js_std_file_proto_funcs));
    JS_SetClassProto(ctx, js_std_file_class_id, proto);

    JS_SetModuleExportList(ctx, m, js_std_funcs,
                           countof(js_std_funcs));
    JS_SetModuleExport(ctx, m, "in", js_new_std_file(ctx, stdin, FALSE, FALSE));
    JS_SetModuleExport(ctx, m, "out", js_new_std_file(ctx, stdout, FALSE, FALSE));
    JS_SetModuleExport(ctx, m, "err", js_new_std_file(ctx, stderr, FALSE, FALSE));
    return 0;
}